

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators_inl.hpp
# Opt level: O2

path_type CLI::detail::check_path(char *file)

{
  int iVar1;
  path_type pVar2;
  stat buffer;
  stat sStack_98;
  
  iVar1 = stat(file,&sStack_98);
  pVar2 = ((sStack_98.st_mode >> 0xe & 1) != 0) + file;
  if (iVar1 != 0) {
    pVar2 = nonexistent;
  }
  return pVar2;
}

Assistant:

CLI11_INLINE path_type check_path(const char *file) noexcept {
#if defined(_MSC_VER)
    struct __stat64 buffer;
    if(_stat64(file, &buffer) == 0) {
        return ((buffer.st_mode & S_IFDIR) != 0) ? path_type::directory : path_type::file;
    }
#else
    struct stat buffer;
    if(stat(file, &buffer) == 0) {
        return ((buffer.st_mode & S_IFDIR) != 0) ? path_type::directory : path_type::file;
    }
#endif
    return path_type::nonexistent;
}